

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolver_sync.c
# Opt level: O1

addrinfo * dns_resolver_get_addrInfo(DNSRESOLVER_HANDLE dns_in)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  char *pcVar3;
  
  if (dns_in == (DNSRESOLVER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar3 = "NULL dns";
      iVar2 = 0xfc;
LAB_0010c5b0:
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/dns_resolver_sync.c"
                ,"dns_resolver_get_addrInfo",iVar2,1,pcVar3);
      return (addrinfo *)0x0;
    }
  }
  else if (*(char *)((long)dns_in + 0x10) == '\x01') {
    if (*(char *)((long)dns_in + 0x11) == '\0') {
      return *(addrinfo **)((long)dns_in + 0x18);
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar3 = "dns_resolver_get_ipv4 when not complete";
      iVar2 = 0x111;
      goto LAB_0010c5b0;
    }
  }
  return (addrinfo *)0x0;
}

Assistant:

struct addrinfo* dns_resolver_get_addrInfo(DNSRESOLVER_HANDLE dns_in)
{
    DNSRESOLVER_INSTANCE* dns = (DNSRESOLVER_INSTANCE*)dns_in;
    struct addrinfo* result;
    if (dns == NULL)
    {
        /* Codes_SRS_dns_resolver_30_030: [ If the dns parameter is NULL, dns_resolver_get_ipv4 shall log an error and return 0. ]*/
        LogError("NULL dns");
        result = NULL;
    }
    else
    {
        if (dns->is_complete)
        {
            if (dns->is_failed)
            {
                /* Codes_SRS_dns_resolver_30_033: [ If dns_resolver_is_create_complete has returned true and the lookup process has failed, dns_resolver_get_ipv4 shall return 0. ]*/
                result = NULL;
            }
            else
            {
                /* Codes_SRS_dns_resolver_30_032: [ If dns_resolver_is_create_complete has returned true and the lookup process has succeeded, dns_resolver_get_ipv4 shall return the discovered IPv4 address. ]*/
                result = dns->addrInfo;
            }
        }
        else
        {
            /* Codes_SRS_dns_resolver_30_031: [ If dns_resolver_is_create_complete has not yet returned true, dns_resolver_get_ipv4 shall log an error and return 0. ]*/
            LogError("dns_resolver_get_ipv4 when not complete");
            result = NULL;
        }
    }
    return result;
}